

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O1

int __thiscall Heuristics::evaluateStateBestFirst(Heuristics *this,Table currentState)

{
  Cell *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Table *pTVar6;
  int j;
  long lVar7;
  int i;
  long lVar8;
  
  lVar8 = 0;
  pTVar6 = &currentState;
  iVar3 = 0;
  do {
    lVar7 = 0;
    do {
      this_00 = pTVar6->table[0] + lVar7;
      cVar1 = Cell::getNumber(this_00);
      if (cVar1 != ' ') {
        cVar1 = Cell::getNumber(this_00);
        iVar2 = cVar1 + -0x31;
        iVar4 = ((int)((ulong)((long)iVar2 * 0x55555555) >> 0x20) - (int)cVar1) + 0x31;
        iVar5 = ((iVar4 >> 1) - (iVar4 >> 0x1f)) + (int)lVar8;
        iVar4 = -iVar5;
        if (0 < iVar5) {
          iVar4 = iVar5;
        }
        iVar5 = ((iVar2 / 3) * 3 - iVar2) + (int)lVar7;
        iVar2 = -iVar5;
        if (0 < iVar5) {
          iVar2 = iVar5;
        }
        iVar3 = iVar2 + iVar3 + iVar4;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar8 = lVar8 + 1;
    pTVar6 = (Table *)(pTVar6->table + 1);
  } while (lVar8 != 3);
  return iVar3;
}

Assistant:

int Heuristics::evaluateStateBestFirst(Table currentState) {
    int distance = 0;
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
        }
    }
    return distance;
}